

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::AddFrameworkItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  pointer pcVar1;
  cmGlobalGenerator *this_00;
  size_t sVar2;
  pointer pcVar3;
  int iVar4;
  ostream *poVar5;
  string *psVar6;
  const_iterator cVar7;
  FrameworkFormat format;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  optional<cmGlobalGenerator::FrameworkDescriptor> fwDescriptor;
  ostringstream e;
  string local_240;
  ItemIsPath local_21c;
  FeatureDescriptor *local_218;
  FeatureDescriptor *local_210;
  _Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> local_208;
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  this_00 = this->GlobalGenerator;
  sVar2 = (entry->Feature)._M_string_length;
  format = Extended;
  if (sVar2 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
    if (sVar2 == 0) {
      format = Relaxed;
    }
    else {
      iVar4 = bcmp((entry->Feature)._M_dataplus._M_p,
                   cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,sVar2);
      format = Extended - (iVar4 == 0);
    }
  }
  cmGlobalGenerator::SplitFrameworkPath
            ((optional<cmGlobalGenerator::FrameworkDescriptor> *)&local_208,this_00,(string *)entry,
             format);
  if (local_208._M_engaged == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Could not parse framework path \"",0x20);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(entry->Item).Value._M_dataplus._M_p,
                        (entry->Item).Value._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"linked by target ",0x11);
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    goto LAB_0037e449;
  }
  if (local_208._M_payload._M_value.Directory._M_string_length != 0) {
    pVar8 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->FrameworkPathsEmitted,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_208);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->FrameworkPaths,(value_type *)&local_208);
    }
  }
  cmGlobalGenerator::FrameworkDescriptor::GetFullPath_abi_cxx11_
            ((string *)local_1a0,(FrameworkDescriptor *)&local_208);
  AddLibraryRuntimeInfo(this,(string *)local_1a0);
  pcVar1 = local_1a0 + 0x10;
  if ((pointer)local_1a0._0_8_ != pcVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  sVar2 = (entry->Feature)._M_string_length;
  if (sVar2 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
    if (sVar2 != 0) {
      iVar4 = bcmp((entry->Feature)._M_dataplus._M_p,
                   cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,sVar2);
      if (iVar4 != 0) goto LAB_0037e16d;
    }
    local_1a0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"FRAMEWORK","");
    AddLibraryFeature(this,(string *)local_1a0);
    if ((pointer)local_1a0._0_8_ != pcVar1) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
  }
LAB_0037e16d:
  iVar4 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
  if ((char)iVar4 == '\0') {
    cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
              ((string *)local_1a0,(FrameworkDescriptor *)&local_208);
    local_21c = Yes;
    local_210 = (FeatureDescriptor *)0x0;
    sVar2 = (entry->Feature)._M_string_length;
    if (sVar2 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
      if (sVar2 != 0) {
        iVar4 = bcmp((entry->Feature)._M_dataplus._M_p,
                     cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,sVar2);
        if (iVar4 != 0) goto LAB_0037e31f;
      }
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"FRAMEWORK","");
    }
    else {
LAB_0037e31f:
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      pcVar3 = (entry->Feature)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)&local_240,pcVar3,pcVar3 + sVar2);
    }
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
            ::find(&(this->LibraryFeatureDescriptors)._M_t,&local_240);
    local_218 = (FeatureDescriptor *)0x0;
    if ((_Rb_tree_header *)cVar7._M_node !=
        &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
      local_218 = (FeatureDescriptor *)(cVar7._M_node + 2);
    }
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a0,&local_21c,&local_210,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_218 = (FeatureDescriptor *)CONCAT44(local_218._4_4_,1);
    local_240._M_dataplus._M_p = (pointer)0x0;
    sVar2 = (entry->Feature)._M_string_length;
    if (sVar2 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
      if (sVar2 != 0) {
        iVar4 = bcmp((entry->Feature)._M_dataplus._M_p,
                     cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,sVar2);
        if (iVar4 != 0) goto LAB_0037e1c1;
      }
      local_1a0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"FRAMEWORK","");
    }
    else {
LAB_0037e1c1:
      pcVar3 = (entry->Feature)._M_dataplus._M_p;
      local_1a0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char*>((string *)local_1a0,pcVar3,pcVar3 + sVar2);
    }
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
            ::find(&(this->LibraryFeatureDescriptors)._M_t,(key_type *)local_1a0);
    local_210 = (FeatureDescriptor *)0x0;
    if ((_Rb_tree_header *)cVar7._M_node !=
        &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
      local_210 = (FeatureDescriptor *)(cVar7._M_node + 2);
    }
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string_const&,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry,
               (ItemIsPath *)&local_218,(void **)&local_240,&local_210);
  }
  if ((pointer)local_1a0._0_8_ != pcVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
LAB_0037e449:
  if (local_208._M_engaged == true) {
    std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::_M_destroy(&local_208);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddFrameworkItem(LinkEntry const& entry)
{
  std::string const& item = entry.Item.Value;

  // Try to separate the framework name and path.
  auto fwDescriptor = this->GlobalGenerator->SplitFrameworkPath(
    item,
    entry.Feature == DEFAULT ? cmGlobalGenerator::FrameworkFormat::Relaxed
                             : cmGlobalGenerator::FrameworkFormat::Extended);
  if (!fwDescriptor) {
    std::ostringstream e;
    e << "Could not parse framework path \"" << item << "\" "
      << "linked by target " << this->Target->GetName() << ".";
    cmSystemTools::Error(e.str());
    return;
  }

  const std::string& fw_path = fwDescriptor->Directory;
  if (!fw_path.empty()) {
    // Add the directory portion to the framework search path.
    this->AddFrameworkPath(fw_path);
  }

  // add runtime information
  this->AddLibraryRuntimeInfo(fwDescriptor->GetFullPath());

  if (entry.Feature == DEFAULT) {
    // ensure FRAMEWORK feature is loaded
    this->AddLibraryFeature("FRAMEWORK");
  }

  if (this->GlobalGenerator->IsXcode()) {
    // Add framework path - it will be handled by Xcode after it's added to
    // "Link Binary With Libraries" build phase
    this->Items.emplace_back(item, ItemIsPath::Yes, nullptr,
                             this->FindLibraryFeature(entry.Feature == DEFAULT
                                                        ? "FRAMEWORK"
                                                        : entry.Feature));
  } else {
    this->Items.emplace_back(
      fwDescriptor->GetLinkName(), ItemIsPath::Yes, nullptr,
      this->FindLibraryFeature(entry.Feature == DEFAULT ? "FRAMEWORK"
                                                        : entry.Feature));
  }
}